

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_b44.c
# Opt level: O0

uint64_t compute_scratch_buffer_size(exr_decode_pipeline_t *decode,uint64_t uncompressed_size)

{
  exr_coding_channel_info_t *peVar1;
  int c;
  uint64_t comp;
  uint64_t ret;
  int ny;
  int nx;
  exr_coding_channel_info_t *curc;
  uint64_t uncompressed_size_local;
  exr_decode_pipeline_t *decode_local;
  
  comp = 0;
  for (c = 0; c < decode->channel_count; c = c + 1) {
    peVar1 = decode->channels;
    nx = peVar1[c].width;
    ny = peVar1[c].height;
    if (nx % 4 != 0) {
      nx = (4 - nx % 4) + nx;
    }
    if (ny % 4 != 0) {
      ny = (4 - ny % 4) + ny;
    }
    comp = (long)ny * (long)nx * (long)peVar1[c].bytes_per_element + comp;
  }
  ret = uncompressed_size;
  if (uncompressed_size < comp) {
    ret = comp;
  }
  return ret;
}

Assistant:

static uint64_t
compute_scratch_buffer_size (
    exr_decode_pipeline_t* decode, uint64_t uncompressed_size)
{
    const exr_coding_channel_info_t* curc;
    int                              nx, ny;
    uint64_t                         ret  = uncompressed_size;
    uint64_t                         comp = 0;

    for (int c = 0; c < decode->channel_count; ++c)
    {
        curc = decode->channels + c;

        nx = curc->width;
        ny = curc->height;

        if (nx % 4) nx += 4 - nx % 4;
        if (ny % 4) ny += 4 - ny % 4;

        comp += (uint64_t) (ny) * (uint64_t) (nx) *
                (uint64_t) (curc->bytes_per_element);
    }
    if (comp > ret) ret = comp;
    return ret;
}